

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

JSONNode __thiscall JSONNode::duplicate(JSONNode *this)

{
  internalJSONNode *piVar1;
  internalJSONNode *piVar2;
  JSONNode *in_RSI;
  allocator local_41;
  json_string local_40;
  
  piVar1 = in_RSI->internal;
  std::__cxx11::string::string((string *)&local_40,"no internal",&local_41);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  JSONNode(this,in_RSI);
  piVar1 = in_RSI->internal;
  piVar2 = this->internal;
  std::__cxx11::string::string
            ((string *)&local_40,"copy ctor failed to ref count correctly",&local_41);
  JSONDebug::_JSON_ASSERT(piVar1 == piVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  makeUniqueInternal(this);
  piVar1 = in_RSI->internal;
  piVar2 = this->internal;
  std::__cxx11::string::string((string *)&local_40,"makeUniqueInternal failed",&local_41);
  JSONDebug::_JSON_ASSERT(piVar1 != piVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode JSONNode::duplicate(void) const json_nothrow {
    JSON_CHECK_INTERNAL();
    JSONNode mycopy(*this);
    #ifdef JSON_REF_COUNT
	   JSON_ASSERT(internal == mycopy.internal, JSON_TEXT("copy ctor failed to ref count correctly"));
	   mycopy.makeUniqueInternal();
    #endif
    JSON_ASSERT(internal != mycopy.internal, JSON_TEXT("makeUniqueInternal failed"));
    return mycopy;
}